

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_ptr_array.c
# Opt level: O2

int zt_ptr_array_move_idx_to_idx(zt_ptr_array *array,int32_t src_idx,int32_t dst_idx)

{
  if (array->count < dst_idx || array->count < src_idx) {
    return -1;
  }
  array->array[dst_idx] = array->array[src_idx];
  return 0;
}

Assistant:

int
zt_ptr_array_move_idx_to_idx(zt_ptr_array * array, int32_t src_idx, int32_t dst_idx) {
    if (src_idx > array->count) {
        return -1;
    }

    if (dst_idx > array->count) {
        return -1;
    }

    array->array[dst_idx] = array->array[src_idx];

    return 0;
}